

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgtweak.c
# Opt level: O1

void paramRead(void)

{
  Param[0].value = (uint)DAT_001060e1;
  Param[1].value = (uint)DAT_001060e2;
  Param[6].value = (uint)DAT_001060e3;
  Param[7].value = (uint)DAT_001060e4;
  Param[2].value = (uint)DAT_001060e6;
  Param[3].value = (uint)DAT_001060e5;
  Param[4].value = (uint)ZvgMon;
  Param[5].value = (uint)DAT_001060e7;
  return;
}

Assistant:

void paramRead( void)
{
	Param[ZSHIFT].value = ZvgMon.zShift;
	Param[ZOSHOOT].value = ZvgMon.oShoot;
	Param[ZJUMP].value = ZvgMon.jumpFactor;
	Param[ZSETTLE].value = ZvgMon.settle;
	Param[ZMAXINT].value = ZvgMon.max_i;
	Param[ZMININT].value = ZvgMon.min_i;
	Param[ZPOINT].value = ZvgMon.point_i;
	Param[ZSIZE].value = ZvgMon.scale;
}